

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_add_sample(bcf_hdr_t *h,char *s)

{
  uint *puVar1;
  khint_t kVar2;
  uint uVar3;
  kh_vdict_t *h_00;
  bcf_idinfo_t *pbVar4;
  bcf_idpair_t *pbVar5;
  char cVar6;
  khint_t kVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined8 in_RAX;
  ushort **ppuVar12;
  char *pcVar13;
  char **ppcVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  undefined4 *extraout_RDX;
  uint uVar18;
  char *__s2;
  bcf_hdr_t *h_01;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int ret;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (s != (char *)0x0) {
    if (*s == '\0') {
      __s2 = s;
      h_01 = h;
      ppuVar12 = __ctype_b_loc();
      pcVar13 = s + 1;
      do {
        if ((**ppuVar12 >> 0xd & 1) == 0) goto LAB_001138ed;
        cVar6 = *pcVar13;
        pcVar13 = pcVar13 + 1;
      } while (cVar6 == '\0');
    }
    h_00 = (kh_vdict_t *)h->dict[2];
    pcVar13 = strdup(s);
    __s2 = pcVar13;
    kVar7 = kh_put_vdict(h_00,pcVar13,&local_34);
    if (local_34 == 0) {
      if (hts_verbose < 2) {
        free(pcVar13);
        return -1;
      }
      bcf_hdr_add_sample_cold_1();
      h_01 = (bcf_hdr_t *)s;
LAB_001138ed:
      bcf_hdr_add_sample_cold_2();
      if (*(uint *)&h_01->field_0xc <= (uint)h_01->n[2]) {
        uVar17 = h_01->n[0];
        if ((uint)(h_01->n[1] * 2) < uVar17) {
          kVar7 = uVar17 - 1;
        }
        else {
          kVar7 = uVar17 + 1;
        }
        iVar8 = kh_resize_vdict((kh_vdict_t *)h_01,kVar7);
        if (iVar8 < 0) {
          *extraout_RDX = 0xffffffff;
          return h_01->n[0];
        }
      }
      uVar17 = h_01->n[0];
      uVar19 = (uint)*__s2;
      if (*__s2 == '\0') {
        uVar19 = 0;
      }
      else {
        cVar6 = __s2[1];
        if (cVar6 != '\0') {
          pcVar13 = __s2 + 2;
          do {
            uVar19 = (int)cVar6 + uVar19 * 0x1f;
            cVar6 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar6 != '\0');
        }
      }
      uVar19 = uVar19 & uVar17 - 1;
      pbVar5 = h_01->id[0];
      if ((*(uint *)((long)&pbVar5->key + (ulong)(uVar19 >> 4) * 4) >>
           ((char)uVar19 * '\x02' & 0x1fU) & 2) == 0) {
        iVar8 = 1;
        uVar20 = uVar19;
        uVar21 = uVar17;
        do {
          uVar3 = *(uint *)((long)&pbVar5->key + (ulong)(uVar20 >> 4) * 4);
          uVar18 = uVar20 * 2 & 0x1e;
          uVar9 = uVar3 >> (sbyte)uVar18;
          uVar11 = uVar17;
          if (((uVar9 & 2) != 0) ||
             (((uVar9 & 1) == 0 && (iVar10 = strcmp((&h_01->id[1]->key)[uVar20],__s2), iVar10 == 0))
             )) break;
          if ((uVar3 >> uVar18 & 1) != 0) {
            uVar21 = uVar20;
          }
          uVar20 = uVar20 + iVar8 & uVar17 - 1;
          iVar8 = iVar8 + 1;
          uVar11 = uVar21;
        } while (uVar20 != uVar19);
        uVar19 = uVar11;
        if (uVar11 == uVar17) {
          if (uVar21 == uVar17) {
            uVar21 = uVar20;
          }
          uVar19 = uVar21;
          if ((*(uint *)((long)&pbVar5->key + (ulong)(uVar20 >> 4) * 4) >>
               ((char)uVar20 * '\x02' & 0x1fU) & 2) == 0) {
            uVar19 = uVar20;
          }
        }
      }
      uVar15 = (ulong)(uVar19 >> 4);
      bVar16 = (char)uVar19 * '\x02' & 0x1e;
      uVar17 = *(uint *)((long)&pbVar5->key + uVar15 * 4) >> bVar16;
      if ((uVar17 & 2) == 0) {
        if ((uVar17 & 1) == 0) {
          *extraout_RDX = 0;
        }
        else {
          (&h_01->id[1]->key)[uVar19] = __s2;
          puVar1 = (uint *)((long)&h_01->id[0]->key + uVar15 * 4);
          *puVar1 = *puVar1 & ~(3 << bVar16);
          h_01->n[1] = h_01->n[1] + 1;
          *extraout_RDX = 2;
        }
      }
      else {
        (&h_01->id[1]->key)[uVar19] = __s2;
        puVar1 = (uint *)((long)&h_01->id[0]->key + uVar15 * 4);
        *puVar1 = *puVar1 & ~(3 << bVar16);
        h_01->n[1] = h_01->n[1] + 1;
        h_01->n[2] = h_01->n[2] + 1;
        *extraout_RDX = 1;
      }
      return uVar19;
    }
    pbVar4 = h_00->vals;
    pbVar4[(int)kVar7].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar4[(int)kVar7].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar4[(int)kVar7].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar4[(int)kVar7].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar4 = pbVar4 + (int)kVar7;
    pbVar4->info[0] = 0xf;
    pbVar4->info[1] = 0xf;
    *(undefined8 *)(pbVar4->info + 2) = 0xf;
    kVar2 = h_00->size;
    h_00->vals[(int)kVar7].id = kVar2 - 1;
    ppcVar14 = (char **)realloc(h->samples,(long)(int)kVar2 * 8);
    h->samples = ppcVar14;
    ppcVar14[(long)(int)kVar2 + -1] = pcVar13;
    h->dirty = 1;
  }
  return 0;
}

Assistant:

int bcf_hdr_add_sample(bcf_hdr_t *h, const char *s)
{
    if ( !s ) return 0;

    const char *ss = s;
    while ( !*ss && isspace(*ss) ) ss++;
    if ( !*ss )
    {
        fprintf(stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n", __func__);
        abort();
    }

    vdict_t *d = (vdict_t*)h->dict[BCF_DT_SAMPLE];
    int ret;
    char *sdup = strdup(s);
    int k = kh_put(vdict, d, sdup, &ret);
    if (ret) { // absent
        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = kh_size(d) - 1;
    } else {
        if (hts_verbose >= 2)
        {
            fprintf(stderr, "[E::%s] Duplicated sample name '%s'\n", __func__, s);
            abort();
        }
        free(sdup);
        return -1;
    }
    int n = kh_size(d);
    h->samples = (char**) realloc(h->samples,sizeof(char*)*n);
    h->samples[n-1] = sdup;
    h->dirty = 1;
    return 0;
}